

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

long __thiscall
OpenSSLWrapper::SslConnection::CheckServerCertificate(SslConnection *this,char *szHostName)

{
  pointer pbVar1;
  pointer __last;
  bool bVar2;
  X509 *a;
  long lVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vstrAltNames;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  string strComName;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_38;
  
  strComName._M_dataplus._M_p = (pointer)&strComName.field_2;
  strComName._M_string_length = 0;
  strComName.field_2._M_local_buf[0] = '\0';
  vstrAltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vstrAltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vstrAltNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  a = (X509 *)SSL_get1_peer_certificate(this->m_ssl);
  if (a != (X509 *)0x0) {
    GetCertInformation((X509 *)a,&strComName,&vstrAltNames);
    X509_free(a);
  }
  lVar3 = SSL_get_verify_result((SSL *)this->m_ssl);
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/OpenSSLWraper.cpp:827:51)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/OpenSSLWraper.cpp:827:51)>
             ::_M_manager;
  local_78._M_unused._0_8_ = (undefined8)szHostName;
  bVar2 = std::operator!=(&strComName,szHostName);
  __last = vstrAltNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = vstrAltNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 == 0 && bVar2) {
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_38,
               (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_78);
    _Var4 = std::
            find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::function<bool(std::__cxx11::string&)>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )pbVar1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )__last,&local_38);
    pbVar1 = vstrAltNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::_Function_base::~_Function_base(&local_38.super__Function_base);
    lVar3 = 0x3e;
    if (_Var4._M_current != pbVar1) {
      lVar3 = 0;
    }
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vstrAltNames);
  std::__cxx11::string::~string((string *)&strComName);
  return lVar3;
}

Assistant:

long SslConnection::CheckServerCertificate(const char* szHostName)
    {
        // Check 1, is a certificate present
        string strComName;
        vector<string> vstrAltNames;

#if OPENSSL_VERSION_NUMBER >= 0x30000000L
        X509* cert = SSL_get1_peer_certificate(m_ssl);
#else
        X509* cert = SSL_get_peer_certificate(m_ssl);
#endif
        if (cert)
        {
            GetCertInformation(cert, strComName, vstrAltNames);
            X509_free(cert);
        } /* Free immediately */

        // Check 2, is it verified?
        long lResult = SSL_get_verify_result(m_ssl);

        // Check 3, compare common name
        function<bool(string&)> fnDomainCompare = [szHostName](string& it) -> bool
        {
            if (it[0] == '^')   // we have a regular expression
                return regex_match(szHostName, regex(it));
            else
                return it.compare(szHostName) == 0 ? true : false;
        };

        if (strComName != szHostName && lResult == X509_V_OK && find_if(begin(vstrAltNames), end(vstrAltNames), fnDomainCompare) == end(vstrAltNames))
            lResult = X509_V_ERR_HOSTNAME_MISMATCH;
        return lResult;
    }